

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

bool __thiscall QTableWidgetItem::isSelected(QTableWidgetItem *this)

{
  byte bVar1;
  QItemSelectionModel *pQVar2;
  QTableModel *__s;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  QTableModel *model;
  QModelIndex index;
  QAbstractItemView *this_00;
  bool local_21;
  undefined1 *local_20;
  undefined1 *local_18;
  QTableWidgetItem *local_10;
  Data *local_8;
  
  local_8 = *(Data **)(in_FS_OFFSET + 0x28);
  if (*(long *)&in_RDI[1].super_QAbstractScrollArea.super_QFrame.super_QWidget != 0) {
    this_00 = in_RDI;
    pQVar2 = QAbstractItemView::selectionModel(in_RDI);
    if (pQVar2 != (QItemSelectionModel *)0x0) {
      QAbstractItemView::model(this_00);
      __s = qobject_cast<QTableModel_const*>((QObject *)0x8d8430);
      if (__s == (QTableModel *)0x0) {
        local_21 = false;
      }
      else {
        local_20 = &DAT_aaaaaaaaaaaaaaaa;
        local_18 = &DAT_aaaaaaaaaaaaaaaa;
        local_10 = (QTableWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
        QTableModel::index((QTableModel *)&local_20,(char *)__s,(int)in_RDI);
        pQVar2 = QAbstractItemView::selectionModel(in_RDI);
        bVar1 = QItemSelectionModel::isSelected((QModelIndex *)pQVar2);
        local_21 = (bool)(bVar1 & 1);
      }
      goto LAB_008d849d;
    }
  }
  local_21 = false;
LAB_008d849d:
  if (*(Data **)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QTableWidgetItem::isSelected() const
{
    if (!view || !view->selectionModel())
        return false;
    const QTableModel *model = qobject_cast<const QTableModel*>(view->model());
    if (!model)
        return false;
    const QModelIndex index = model->index(this);
    return view->selectionModel()->isSelected(index);
}